

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O3

void __thiscall
v_hashmap<substring,_features_*>::double_size(v_hashmap<substring,_features_*> *this)

{
  undefined8 *puVar1;
  uint64_t uVar2;
  char *pcVar3;
  hash_elem *phVar4;
  hash_elem *phVar5;
  v_array<v_hashmap<substring,_features_*>::hash_elem> *__range2;
  hash_elem *e;
  hash_elem *phVar6;
  v_array<v_hashmap<substring,_features_*>::hash_elem> local_48;
  
  local_48.end_array = (hash_elem *)0x0;
  local_48.erase_count = 0;
  local_48._begin = (hash_elem *)0x0;
  local_48._end = (hash_elem *)0x0;
  v_array<v_hashmap<substring,_features_*>::hash_elem>::resize
            (&local_48,*(long *)(this + 0x40) + 10);
  phVar5 = *(hash_elem **)(this + 0x18);
  phVar4 = *(hash_elem **)(this + 0x28);
  phVar6 = phVar5;
  if (phVar5 != phVar4) {
    do {
      if (phVar5->occupied == true) {
        v_array<v_hashmap<substring,_features_*>::hash_elem>::push_back(&local_48,phVar5);
        phVar4 = *(hash_elem **)(this + 0x28);
      }
      phVar5 = phVar5 + 1;
    } while (phVar5 != phVar4);
    phVar5 = phVar4;
    phVar6 = ((v_array<v_hashmap<substring,_features_*>::hash_elem> *)(this + 0x18))->_begin;
  }
  v_array<v_hashmap<substring,_features_*>::hash_elem>::resize
            ((v_array<v_hashmap<substring,_features_*>::hash_elem> *)(this + 0x18),
             ((long)phVar5 - (long)phVar6 >> 3) * -0x6666666666666666);
  memset(*(void **)(this + 0x18),0,*(long *)(this + 0x28) - (long)*(void **)(this + 0x18));
  phVar4 = local_48._end;
  for (phVar5 = local_48._begin; phVar5 != phVar4; phVar5 = phVar5 + 1) {
    get(this,&phVar5->key,phVar5->hash);
    uVar2 = phVar5->hash;
    *(undefined1 *)(*(long *)(this + 0x18) + *(long *)(this + 0x38) * 0x28) = 1;
    pcVar3 = (phVar5->key).end;
    puVar1 = (undefined8 *)(*(long *)(this + 0x18) + 8 + *(long *)(this + 0x38) * 0x28);
    *puVar1 = (phVar5->key).begin;
    puVar1[1] = pcVar3;
    *(features **)(*(long *)(this + 0x18) + 0x18 + *(long *)(this + 0x38) * 0x28) = phVar5->val;
    *(uint64_t *)(*(long *)(this + 0x18) + 0x20 + *(long *)(this + 0x38) * 0x28) = uVar2;
  }
  if (local_48._begin != (hash_elem *)0x0) {
    free(local_48._begin);
  }
  return;
}

Assistant:

void double_size()
  {  //    printf("doubling size!\n");
    // remember the old occupants
    v_array<hash_elem> tmp = v_array<hash_elem>();
    tmp.resize(num_occupants + 10);
    for (hash_elem* e = dat.begin(); e != dat.end_array; e++)
      if (e->occupied)
        tmp.push_back(*e);

    // double the size and clear
    // std::cerr<<"doubling to "<<(base_size()*2) << " units == " << (base_size()*2*sizeof(hash_elem)) << " bytes / " <<
    // ((size_t)-1)<<std::endl;
    dat.resize(base_size() * 2);
    memset(dat.begin(), 0, base_size() * sizeof(hash_elem));

    // re-insert occupants
    for (auto& e : tmp)
    {
      get(e.key, e.hash);
      //      std::cerr << "reinserting " << e->key << " at " << last_position << std::endl;
      put_after_get_nogrow(e.key, e.hash, e.val);
    }
    tmp.delete_v();
  }